

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlexer.cpp
# Opt level: O0

void __thiscall SQLexer::LexBlockComment(SQLexer *this)

{
  byte bVar1;
  bool bVar2;
  uint uVar3;
  long in_RDI;
  bool done;
  SQChar *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  
  bVar2 = false;
LAB_001342f8:
  do {
    while( true ) {
      if (bVar2) {
        return;
      }
      bVar1 = *(byte *)(in_RDI + 0x60);
      uVar3 = (uint)bVar1;
      if (uVar3 != 0) break;
      Error((SQLexer *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffd8);
LAB_001343be:
      Next((SQLexer *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    }
    if (uVar3 == 10) {
      *(long *)(in_RDI + 0x20) = *(long *)(in_RDI + 0x20) + 1;
      Next((SQLexer *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
      goto LAB_001342f8;
    }
    if (uVar3 != 0x2a) goto LAB_001343be;
    Next((SQLexer *)(ulong)CONCAT14(bVar1,in_stack_ffffffffffffffe0));
    *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    if (*(char *)(in_RDI + 0x60) == '/') {
      bVar2 = true;
      Next((SQLexer *)CONCAT44(uVar3,in_stack_ffffffffffffffe0));
      *(long *)(in_RDI + 0x30) = *(long *)(in_RDI + 0x30) + 1;
    }
  } while( true );
}

Assistant:

void SQLexer::LexBlockComment()
{
    bool done = false;
    while(!done) {
        switch(CUR_CHAR) {
            case _SC('*'): { NEXT(); if(CUR_CHAR == _SC('/')) { done = true; NEXT(); }}; continue;
            case _SC('\n'): _currentline++; NEXT(); continue;
            case SQUIRREL_EOB: Error(_SC("missing \"*/\" in comment"));
            default: NEXT();
        }
    }
}